

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::MultiFileReader::GetConstantVirtualColumn
          (MultiFileReader *this,MultiFileReaderData *reader_data,idx_t column_id,LogicalType *type)

{
  LogicalType *in_R8;
  _func_int **local_70;
  LogicalType local_68;
  Value local_50;
  
  if (type == (LogicalType *)0xfffffffffffffffe) {
    LogicalType::LogicalType(&local_68,in_R8);
    Value::Value(&local_50,&local_68);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_70,&local_50);
    this->_vptr_MultiFileReader = local_70;
    local_70 = (_func_int **)0x0;
    Value::~Value(&local_50);
    LogicalType::~LogicalType(&local_68);
  }
  else {
    this->_vptr_MultiFileReader = (_func_int **)0x0;
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> MultiFileReader::GetConstantVirtualColumn(MultiFileReaderData &reader_data, idx_t column_id,
                                                                 const LogicalType &type) {
	if (column_id == COLUMN_IDENTIFIER_EMPTY || column_id == COLUMN_IDENTIFIER_FILENAME) {
		return make_uniq<BoundConstantExpression>(Value(type));
	}
	return nullptr;
}